

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     ,WebPPicture *pic,int percent_range,int *percent)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *__s;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint32_t uVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  
  iVar19 = ysize * xsize;
  uVar4 = 0xfff88;
  if (quality < 0x4c) {
    if (quality < 0x33) {
      uVar4 = xsize << ((0x19 < quality) * '\x02' | 4U);
    }
    else {
      uVar4 = xsize << 8;
    }
  }
  uVar15 = 0xfff88;
  if ((int)uVar4 < 0xfff88) {
    uVar15 = uVar4;
  }
  puVar2 = p->offset_length_;
  if (iVar19 < 3) {
    puVar2[(long)iVar19 + -1] = 0;
    *puVar2 = 0;
    return 1;
  }
  iVar1 = *percent;
  __s = WebPSafeMalloc(0x40000,4);
  if (__s == (void *)0x0) {
    iVar19 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar19;
  }
  uVar21 = (uint)(quality * quality) >> 7;
  iVar5 = uVar21 + 8;
  iVar6 = percent_range / 2;
  memset(__s,0xff,0x100000);
  bVar25 = *argb == argb[1];
  uVar20 = iVar19 - 2;
  uVar4 = 0;
  while ((int)uVar4 < (int)uVar20) {
    uVar22 = argb[(long)(int)uVar4 + 1];
    if ((bVar25) && (uVar22 == argb[(long)(int)uVar4 + 2])) {
      uVar22 = argb[(int)uVar4];
      uVar9 = 0xfffff002;
      uVar13 = 1;
      while ((uVar12 = uVar4 + uVar9 + 0x1001, (int)uVar12 < iVar19 && (argb[uVar12] == uVar22))) {
        uVar9 = uVar9 + 1;
        uVar13 = uVar13 + 1;
      }
      if (0xfff < uVar9 + 0xfff) {
        memset(puVar2 + (int)uVar4,0xff,(ulong)uVar9 << 2);
      }
      uVar9 = 0xfff;
      if (0xfff < uVar13) {
        uVar9 = uVar13;
      }
      iVar10 = uVar9 + uVar4 + -0xfff;
      uVar9 = 0xfff;
      if (uVar13 < 0xfff) {
        uVar9 = uVar13;
      }
      uVar12 = uVar22 * 0x5bd1e996 + uVar9 * -0x395b586d;
      uVar9 = uVar13;
      if (0xffe < uVar13) {
        uVar9 = 0xfff;
      }
      for (lVar17 = 0; uVar16 = (uint)lVar17, uVar9 != uVar16; lVar17 = lVar17 + 1) {
        puVar2[iVar10 + lVar17] = *(uint32_t *)((long)__s + (ulong)(uVar12 >> 0xe) * 4);
        *(uint *)((long)__s + (ulong)(uVar12 >> 0xe) * 4) = iVar10 + uVar16;
        uVar12 = uVar12 + 0x395b586d;
      }
      if (uVar13 < 0x1000) {
        uVar13 = 0xfff;
      }
      uVar4 = (uVar4 + uVar13 + uVar16) - 0xfff;
      bVar25 = false;
    }
    else {
      bVar25 = uVar22 == argb[(long)(int)uVar4 + 2];
      uVar24 = (ulong)(argb[(int)uVar4] * 0x5bd1e996 + uVar22 * -0x395b586d >> 0xe);
      puVar2[(int)uVar4] = *(uint32_t *)((long)__s + uVar24 * 4);
      *(uint *)((long)__s + uVar24 * 4) = uVar4;
      uVar4 = uVar4 + 1;
    }
    iVar10 = WebPReportProgress(pic,(int)(uVar4 * iVar6) / (int)uVar20 + iVar1,percent);
    if (iVar10 == 0) {
      WebPSafeFree(__s);
      return 0;
    }
  }
  puVar2[uVar4] =
       *(uint32_t *)
        ((long)__s +
        (ulong)(argb[uVar4] * 0x5bd1e996 + argb[(ulong)uVar4 + 1] * -0x395b586d >> 0xe) * 4);
  WebPSafeFree(__s);
  iVar10 = WebPReportProgress(pic,iVar6 + iVar1,percent);
  if (iVar10 == 0) {
    return 0;
  }
  puVar3 = p->offset_length_;
  puVar3[iVar19 - 1U] = 0;
  *puVar3 = 0;
  iVar10 = uVar21 + 7;
  uVar4 = uVar20;
  do {
    if (uVar4 == 0) {
      iVar19 = WebPReportProgress(pic,iVar1 + percent_range,percent);
      return iVar19;
    }
    iVar11 = (iVar19 - 1U) - uVar4;
    iVar8 = 0xfff;
    if (iVar11 < 0xfff) {
      iVar8 = iVar11;
    }
    uVar24 = 0;
    uVar18 = (ulong)(uVar4 - uVar15);
    if (uVar4 < uVar15) {
      uVar18 = uVar24;
    }
    iVar7 = 0x100;
    if (iVar11 < 0x100) {
      iVar7 = iVar11;
    }
    puVar3 = argb + uVar4;
    uVar22 = puVar2[uVar4];
    if (low_effort == 0) {
      uVar13 = 0;
      uVar24 = 0;
      iVar23 = iVar5;
      uVar21 = 0;
      if (((uint)xsize <= uVar4) &&
         (uVar24 = 0, iVar23 = iVar10, puVar3[-(ulong)(uint)xsize] == *puVar3)) {
        uVar9 = (*VP8LVectorMismatch)(puVar3 + -(ulong)(uint)xsize,puVar3,iVar8);
        uVar24 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar24 = 0;
        }
        uVar21 = 0;
        if (0 < (int)uVar9) {
          uVar21 = xsize;
        }
      }
      if (puVar3[uVar24 - 1] == puVar3[uVar24]) {
        uVar13 = (*VP8LVectorMismatch)(puVar3 + -1,puVar3,iVar8);
      }
      if ((int)uVar24 < (int)uVar13) {
        uVar24 = (ulong)uVar13;
        uVar21 = 1;
      }
      iVar23 = iVar23 + -1;
      if ((int)uVar24 == 0xfff) {
        uVar22 = (int)uVar18 - 1;
      }
    }
    else {
      uVar21 = 0;
      iVar23 = iVar5;
    }
    uVar14 = puVar3[uVar24];
LAB_00166fb8:
    iVar23 = iVar23 + -1;
    if (((int)uVar22 < (int)uVar18) || (iVar23 == 0)) goto LAB_0016704b;
    if ((argb[(int)((int)uVar24 + uVar22)] != uVar14) ||
       (uVar13 = (*VP8LVectorMismatch)(argb + (int)uVar22,puVar3,iVar8), (int)uVar13 <= (int)uVar24)
       ) {
LAB_0016703a:
      uVar22 = puVar2[(int)uVar22];
      goto LAB_00166fb8;
    }
    uVar21 = uVar4 - uVar22;
    if ((int)uVar13 < iVar7) {
      uVar14 = puVar3[uVar13];
      uVar24 = (ulong)uVar13;
      goto LAB_0016703a;
    }
    uVar24 = (ulong)uVar13;
LAB_0016704b:
    puVar3 = p->offset_length_;
    uVar12 = iVar11 * (percent_range - iVar6);
    uVar13 = uVar4;
    uVar9 = uVar4;
    while( true ) {
      uVar4 = uVar13 - 1;
      uVar16 = (uint)uVar24;
      puVar3[uVar13] = uVar16 | uVar21 << 0xc;
      if ((((uVar21 == 0) || (uVar4 == 0)) || (uVar4 < uVar21)) ||
         ((argb[uVar4 - uVar21] != argb[uVar4] ||
          (((uVar21 != 1 && (uVar16 == 0xfff)) && (uVar13 + 0xffe < uVar9)))))) break;
      if ((int)uVar16 < 0xfff) {
        uVar9 = uVar4;
      }
      uVar24 = (ulong)(uVar16 + ((int)uVar16 < 0xfff));
      uVar12 = uVar12 + (percent_range - iVar6);
      uVar13 = uVar4;
    }
    iVar8 = WebPReportProgress(pic,uVar12 / uVar20 + iVar6 + iVar1,percent);
    if (iVar8 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort, const WebPPicture* const pic,
                      int percent_range, int* const percent) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int remaining_percent = percent_range;
  int percent_start = *percent;
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length_ as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length_;
  assert(size > 0);
  assert(p->size_ != 0);
  assert(p->offset_length_ != NULL);

  if (size <= 2) {
    p->offset_length_[0] = p->offset_length_[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  percent_range = remaining_percent / 2;
  remaining_percent -= percent_range;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }

    if (!WebPReportProgress(
            pic, percent_start + percent_range * pos / (size - 2), percent)) {
      WebPSafeFree(hash_to_first_index);
      return 0;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  percent_start += percent_range;
  if (!WebPReportProgress(pic, percent_start, percent)) return 0;
  percent_range = remaining_percent;

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length_[0] = p->offset_length_[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length_[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }

    if (!WebPReportProgress(pic,
                            percent_start + percent_range *
                                                (size - 2 - base_position) /
                                                (size - 2),
                            percent)) {
      return 0;
    }
  }

  return WebPReportProgress(pic, percent_start + percent_range, percent);
}